

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_55(QPDF *pdf,char *arg2)

{
  QPDFPageObjectHelper *ph;
  long lVar1;
  QPDFWriter w;
  QPDFObjectHandle qtest;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  undefined1 local_80 [16];
  element_type *local_70 [2];
  QPDFObjectHandle local_60;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40;
  long local_38;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_80,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_80);
  QPDFObjectHandle::newArray();
  if (local_40 != local_38) {
    lVar1 = local_40;
    do {
      QPDFPageObjectHelper::getFormXObjectForPage(SUB81(local_80,0));
      QPDFObjectHandle::appendItem(&local_60);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      }
      QPDFPageObjectHelper::getFormXObjectForPage(SUB81(local_80,0));
      QPDFObjectHandle::appendItem(&local_60);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      }
      lVar1 = lVar1 + 0x38;
    } while (lVar1 != local_38);
  }
  QPDF::getTrailer();
  local_80._0_8_ = (element_type *)local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"/QTest","");
  QPDFObjectHandle::replaceKey(local_50,(QPDFObjectHandle *)local_80);
  if ((element_type *)local_80._0_8_ != (element_type *)local_70) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_70[0] + 1));
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  QPDFWriter::QPDFWriter((QPDFWriter *)local_80,pdf,"a.pdf");
  QPDFWriter::setQDFMode(SUB81(local_80,0));
  QPDFWriter::setStaticID(SUB81(local_80,0));
  QPDFWriter::write();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_40);
  return;
}

Assistant:

static void
test_55(QPDF& pdf, char const* arg2)
{
    // Form XObjects
    std::vector<QPDFPageObjectHelper> pages = QPDFPageDocumentHelper(pdf).getAllPages();
    QPDFObjectHandle qtest = QPDFObjectHandle::newArray();
    for (auto& ph: pages) {
        qtest.appendItem(ph.getFormXObjectForPage());
        qtest.appendItem(ph.getFormXObjectForPage(false));
    }
    pdf.getTrailer().replaceKey("/QTest", qtest);
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}